

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_bbdpre.c
# Opt level: O0

int IDAAglocal(sunindextype NlocalB,sunrealtype tt,N_Vector yyB,N_Vector ypB,N_Vector gvalB,
              void *ida_mem)

{
  IDAadjMemRec *pIVar1;
  IDABMemRec *pIVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  IDAMem in_R8;
  sunrealtype in_XMM0_Qa;
  int flag;
  IDABBDPrecDataB idabbdB_mem;
  IDABMem IDAB_mem;
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  int local_4;
  
  pIVar1 = in_R8->ida_adj_mem;
  pIVar2 = pIVar1->ia_bckpbCrt;
  puVar3 = (undefined8 *)pIVar2->ida_pmem;
  if ((pIVar1->ia_noInterp == 0) &&
     (iVar4 = (*pIVar1->ia_getY)(in_R8,in_XMM0_Qa,pIVar1->ia_yyTmp,pIVar1->ia_ypTmp,(N_Vector *)0x0,
                                 (N_Vector *)0x0), iVar4 != 0)) {
    IDAProcessError(in_R8,-1,0x387,"IDAAglocal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_bbdpre.c"
                    ,"Bad t for interpolation.");
    local_4 = -1;
  }
  else {
    local_4 = (*(code *)*puVar3)(in_XMM0_Qa,in_RDI,pIVar1->ia_yyTmp,pIVar1->ia_ypTmp,in_RSI,in_RDX,
                                 in_RCX,pIVar2->ida_user_data);
  }
  return local_4;
}

Assistant:

static int IDAAglocal(sunindextype NlocalB, sunrealtype tt, N_Vector yyB,
                      N_Vector ypB, N_Vector gvalB, void* ida_mem)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem IDAB_mem;
  IDABBDPrecDataB idabbdB_mem;
  int flag;

  IDA_mem    = (IDAMem)ida_mem;
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Get current backward problem. */
  IDAB_mem = IDAADJ_mem->ia_bckpbCrt;

  /* Get the preconditioner's memory. */
  idabbdB_mem = (IDABBDPrecDataB)IDAB_mem->ida_pmem;

  /* Get forward solution from interpolation. */
  if (IDAADJ_mem->ia_noInterp == SUNFALSE)
  {
    flag = IDAADJ_mem->ia_getY(IDA_mem, tt, IDAADJ_mem->ia_yyTmp,
                               IDAADJ_mem->ia_ypTmp, NULL, NULL);
    if (flag != IDA_SUCCESS)
    {
      IDAProcessError(IDA_mem, -1, __LINE__, __func__, __FILE__, MSGBBD_BAD_T);
      return (-1);
    }
  }
  /* Call user's adjoint LocalFnB function. */
  return idabbdB_mem->glocalB(NlocalB, tt, IDAADJ_mem->ia_yyTmp,
                              IDAADJ_mem->ia_ypTmp, yyB, ypB, gvalB,
                              IDAB_mem->ida_user_data);
}